

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O3

void __thiscall gdsTEXT::reset(gdsTEXT *this)

{
  (this->presentation_flags).super__Base_bitset<1UL>._M_w = 0;
  this->text_type = 0;
  this->path_type = 0;
  *(undefined8 *)&this->width = 0;
  *(undefined4 *)((long)&(this->text_transformation_flags).super__Base_bitset<1UL>._M_w + 4) = 0;
  std::__cxx11::string::_M_replace
            ((ulong)&this->textbody,0,(char *)(this->textbody)._M_string_length,0x1753f1);
  this->layer = 0;
  this->scale = 1.0;
  this->angle = 0.0;
  this->xCor = 0;
  this->yCor = 0;
  this->propattr = 0;
  std::__cxx11::string::_M_replace
            ((ulong)&this->propvalue,0,(char *)(this->propvalue)._M_string_length,0x1753f1);
  return;
}

Assistant:

void gdsTEXT::reset()
{
  presentation_flags.reset();
  text_type = 0;
  path_type = 0;
  width = 0;
  text_transformation_flags.reset();
  textbody = "\0";
  layer = 0;
  scale = 1;
  angle = 0;
  xCor = 0;
  yCor = 0;
  propattr = 0;
  propvalue = "\0";
}